

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::keymap(void)

{
  if (attr_map<int,std::function<void(void*,void*,int*)>>::keymap()::m == '\0') {
    attr_map<int,std::function<void(void*,void*,int*)>>::keymap();
  }
  return &keymap::m;
}

Assistant:

static std::map<K, int>& keymap(){ static std::map<K, int> m; return m; }